

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_control_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::LFControlEndToEndTest::~LFControlEndToEndTest(LFControlEndToEndTest *this)

{
  anon_unknown.dwarf_17bc3e0::LFControlEndToEndTest::~LFControlEndToEndTest
            ((LFControlEndToEndTest *)(this + -0x18));
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(::libaom_test::kRealTime);

    cfg_.g_threads = threads_;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 600;
    cfg_.kf_max_dist = 9999;
    cfg_.kf_min_dist = 9999;
  }